

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM_x86_fma::forward
          (LSTM_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  _func_int *p_Var2;
  pointer pMVar3;
  int *piVar4;
  int iVar5;
  int _h_00;
  size_t sVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  void *__dest;
  bool bVar10;
  Mat m;
  int local_35c;
  Mat local_358;
  Mat local_308;
  Mat m_3;
  Mat local_268;
  Mat m_1;
  Mat m_4;
  Mat m_2;
  Mat m_5;
  Mat local_c8;
  Mat m_6;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = *(int *)(&this->field_0xd8 + (long)this->_vptr_LSTM_x86_fma[-3]);
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.allocator = (Allocator *)0x0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  local_358.cstep = 0;
  local_358.data = (void *)0x0;
  local_358.refcount._0_4_ = 0;
  local_358.refcount._4_4_ = 0;
  local_358.elemsize._0_4_ = 0;
  local_358.elemsize._4_4_ = 0;
  local_358.elempack = 0;
  local_358.allocator = (Allocator *)0x0;
  local_358.dims = 0;
  local_358.w = 0;
  local_358.h = 0;
  local_358.d = 0;
  local_358.c = 0;
  pvVar8 = (void *)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  _allocator = (&opt->blob_allocator)[pvVar8 != (void *)0xd8];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,(int)opt,pvVar8);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_308.allocator == (Allocator *)0x0) {
          if (local_308.data != (void *)0x0) {
            free(local_308.data);
          }
        }
        else {
          (*(local_308.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_308.data = m.data;
    local_308.refcount._0_4_ = m.refcount._0_4_;
    local_308.refcount._4_4_ = m.refcount._4_4_;
    local_308.elemsize._0_4_ = (undefined4)m.elemsize;
    local_308.elemsize._4_4_ = m.elemsize._4_4_;
    local_308.elempack = m.elempack;
    local_308.allocator = m.allocator;
    local_308.dims = m.dims;
    local_308.w = m.w;
    local_308.h = m.h;
    local_308.d = m.d;
    local_308.c = m.c;
    local_308.cstep = m.cstep;
    sVar6 = m.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
            sVar6 = m.cstep;
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          sVar6 = m.cstep;
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar6,
               pvVar8);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_358.allocator == (Allocator *)0x0) {
          if (local_358.data != (void *)0x0) {
            free(local_358.data);
          }
        }
        else {
          (*(local_358.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_358.data = m.data;
    local_358.refcount._0_4_ = m.refcount._0_4_;
    local_358.refcount._4_4_ = m.refcount._4_4_;
    local_358.elemsize._0_4_ = (undefined4)m.elemsize;
    local_358.elemsize._4_4_ = m.elemsize._4_4_;
    local_358.elempack = m.elempack;
    local_358.allocator = m.allocator;
    local_358.dims = m.dims;
    local_358.w = m.w;
    local_358.h = m.h;
    local_358.d = m.d;
    local_358.c = m.c;
    local_358.cstep = m.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_308,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),_h_00,4,
                _allocator);
    iVar5 = -100;
    if ((local_308.data == (void *)0x0) || ((long)local_308.c * local_308.cstep == 0))
    goto LAB_003c91ce;
    if (0 < local_308.c * (int)local_308.cstep) {
      memset(local_308.data,0,(ulong)(uint)(local_308.c * (int)local_308.cstep) << 2);
    }
    Mat::create(&local_358,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),_h_00,4,
                _allocator);
    if ((local_358.data == (void *)0x0) || ((long)local_358.c * local_358.cstep == 0))
    goto LAB_003c91ce;
    if (0 < local_358.c * (int)local_358.cstep) {
      memset(local_358.data,0,(ulong)(uint)(local_358.c * (int)local_358.cstep) << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]) <<
                      (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar5 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var2 = this->_vptr_LSTM_x86_fma[-3];
    if (*(uint *)(&this->field_0xd8 + (long)p_Var2) < 2) {
      m.w = *(int *)(&this->field_0x154 + (long)p_Var2);
      m.h = *(int *)(&this->field_0x158 + (long)p_Var2);
      m.c = *(int *)(&this->field_0x15c + (long)p_Var2);
      m.data = *(void **)(&this->field_0x128 + (long)p_Var2);
      uVar9 = *(ulong *)(&this->field_0x138 + (long)p_Var2);
      m.elempack = *(int *)(&this->field_0x140 + (long)p_Var2);
      m.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var2);
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar9;
      m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m.d = 1;
      m.dims = *(int *)(&this->field_0x150 + (long)p_Var2) + -1;
      m.cstep = (uVar9 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar9;
      if (*(int *)(&this->field_0x150 + (long)p_Var2) == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = *(int *)(&this->field_0x19c + (long)p_Var2);
      m_1.h = *(int *)(&this->field_0x1a0 + (long)p_Var2);
      m_1.c = *(int *)(&this->field_0x1a4 + (long)p_Var2);
      m_1.data = *(void **)(&this->field_0x170 + (long)p_Var2);
      uVar9 = *(ulong *)(&this->field_0x180 + (long)p_Var2);
      m_1.elempack = *(int *)(&this->field_0x188 + (long)p_Var2);
      m_1.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var2);
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar9;
      m_1.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m_1.d = 1;
      m_1.dims = *(int *)(&this->field_0x198 + (long)p_Var2) + -1;
      m_1.cstep = (uVar9 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar9;
      if (*(int *)(&this->field_0x198 + (long)p_Var2) == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.c = *(int *)(&this->field_0x114 + (long)p_Var2);
      m_2.data = *(void **)(&this->field_0xe0 + (long)p_Var2);
      uVar9 = *(ulong *)(&this->field_0xf0 + (long)p_Var2);
      m_2.elempack = *(int *)(&this->field_0xf8 + (long)p_Var2);
      m_2.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var2);
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)uVar9;
      m_2.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m_2.d = 1;
      m_2.h = *(int *)(&this->field_0x110 + (long)p_Var2);
      sVar6 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) *
              (long)*(int *)(&this->field_0x10c + (long)p_Var2);
      m_2.w = *(int *)(&this->field_0x10c + (long)p_Var2);
      m_2.dims = *(int *)(&this->field_0x108 + (long)p_Var2) + -1;
      m_2.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
      if (*(int *)(&this->field_0x108 + (long)p_Var2) == 4) {
        m_2.cstep = sVar6;
      }
      local_35c = lstm(bottom_blob,this_00,*(uint *)(&this->field_0xd8 + (long)p_Var2),&m,&m_1,&m_2,
                       &local_308,&local_358,opt);
      m_2.cstep = 0;
      m_2.data = (void *)0x0;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = 0;
      m_2.elemsize._4_4_ = 0;
      m_2.elempack = 0;
      m_2.dims = 0;
      m_2.w = 0;
      m_2.h = 0;
      m_2.d = 0;
      m_2.c = 0;
      piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      iVar5 = local_35c;
      if (local_35c != 0) goto LAB_003c91ce;
    }
    if (*(int *)(&this->field_0xd8 + (long)this->_vptr_LSTM_x86_fma[-3]) == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),_h,4,
                  opt->workspace_allocator);
      iVar5 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar10 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),_h,4,
                    opt->workspace_allocator);
        iVar5 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar10 = false;
        }
        else {
          m_2.cstep = (size_t)local_308.w;
          m_2.data = local_308.data;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = (undefined4)local_308.elemsize;
          m_2.elemsize._4_4_ = local_308.elemsize._4_4_;
          m_2.elempack = local_308.elempack;
          m_2.allocator = local_308.allocator;
          m_2.w = local_308.w;
          m_2.dims = 2;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          local_c8.cstep = (size_t)local_358.w;
          local_c8.data = local_358.data;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = (undefined4)local_358.elemsize;
          local_c8.elemsize._4_4_ = local_358.elemsize._4_4_;
          local_c8.elempack = local_358.elempack;
          local_c8.allocator = local_358.allocator;
          local_c8.w = local_358.w;
          local_c8.dims = 2;
          local_c8.h = 1;
          local_c8.d = 1;
          local_c8.c = 1;
          p_Var2 = this->_vptr_LSTM_x86_fma[-3];
          local_268.c = *(int *)(&this->field_0x15c + (long)p_Var2);
          local_268.data = *(void **)(&this->field_0x128 + (long)p_Var2);
          uVar9 = *(ulong *)(&this->field_0x138 + (long)p_Var2);
          local_268.elempack = *(int *)(&this->field_0x140 + (long)p_Var2);
          local_268.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var2);
          local_268.refcount._0_4_ = 0;
          local_268.refcount._4_4_ = 0;
          local_268.elemsize._0_4_ = (undefined4)uVar9;
          local_268.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          local_268.d = 1;
          local_268.h = *(int *)(&this->field_0x158 + (long)p_Var2);
          uVar7 = (long)*(int *)(&this->field_0x158 + (long)p_Var2) *
                  (long)*(int *)(&this->field_0x154 + (long)p_Var2);
          local_268.w = *(int *)(&this->field_0x154 + (long)p_Var2);
          local_268.dims = *(int *)(&this->field_0x150 + (long)p_Var2) + -1;
          local_268.cstep = (uVar9 * uVar7 + 0xf & 0xfffffffffffffff0) / uVar9;
          if (*(int *)(&this->field_0x150 + (long)p_Var2) == 4) {
            local_268.cstep = uVar7;
          }
          m_3.c = *(int *)(&this->field_0x1a4 + (long)p_Var2);
          m_3.data = *(void **)(&this->field_0x170 + (long)p_Var2);
          uVar9 = *(ulong *)(&this->field_0x180 + (long)p_Var2);
          m_3.elempack = *(int *)(&this->field_0x188 + (long)p_Var2);
          m_3.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var2);
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)uVar9;
          m_3.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          m_3.d = 1;
          m_3.h = *(int *)(&this->field_0x1a0 + (long)p_Var2);
          sVar6 = (long)*(int *)(&this->field_0x1a0 + (long)p_Var2) *
                  (long)*(int *)(&this->field_0x19c + (long)p_Var2);
          m_3.w = *(int *)(&this->field_0x19c + (long)p_Var2);
          m_3.dims = *(int *)(&this->field_0x198 + (long)p_Var2) + -1;
          m_3.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
          if (*(int *)(&this->field_0x198 + (long)p_Var2) == 4) {
            m_3.cstep = sVar6;
          }
          m_4.c = *(int *)(&this->field_0x114 + (long)p_Var2);
          m_4.data = *(void **)(&this->field_0xe0 + (long)p_Var2);
          uVar9 = *(ulong *)(&this->field_0xf0 + (long)p_Var2);
          m_4.elempack = *(int *)(&this->field_0xf8 + (long)p_Var2);
          m_4.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var2);
          m_4.refcount._0_4_ = 0;
          m_4.refcount._4_4_ = 0;
          m_4.elemsize._0_4_ = (undefined4)uVar9;
          m_4.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          m_4.d = 1;
          m_4.h = *(int *)(&this->field_0x110 + (long)p_Var2);
          sVar6 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) *
                  (long)*(int *)(&this->field_0x10c + (long)p_Var2);
          m_4.w = *(int *)(&this->field_0x10c + (long)p_Var2);
          m_4.dims = *(int *)(&this->field_0x108 + (long)p_Var2) + -1;
          m_4.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
          if (*(int *)(&this->field_0x108 + (long)p_Var2) == 4) {
            m_4.cstep = sVar6;
          }
          iVar5 = lstm(bottom_blob,&m,0,&local_268,&m_3,&m_4,&m_2,&local_c8,opt);
          m_4.cstep = 0;
          m_4.data = (void *)0x0;
          m_4.refcount._0_4_ = 0;
          m_4.refcount._4_4_ = 0;
          m_4.elemsize._0_4_ = 0;
          m_4.elemsize._4_4_ = 0;
          m_4.elempack = 0;
          m_4.dims = 0;
          m_4.w = 0;
          m_4.h = 0;
          m_4.d = 0;
          m_4.c = 0;
          piVar4 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          piVar4 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_268.allocator == (Allocator *)0x0) {
                if (local_268.data != (void *)0x0) {
                  free(local_268.data);
                }
              }
              else {
                (*(local_268.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar5 == 0) {
            local_268.cstep = (size_t)local_308.w;
            local_268.data =
                 (void *)(CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize) *
                          local_268.cstep + (long)local_308.data);
            local_268.refcount._0_4_ = 0;
            local_268.refcount._4_4_ = 0;
            local_268.elemsize._0_4_ = (undefined4)local_308.elemsize;
            local_268.elemsize._4_4_ = local_308.elemsize._4_4_;
            local_268.elempack = local_308.elempack;
            local_268.allocator = local_308.allocator;
            local_268.w = local_308.w;
            local_268.dims = 2;
            local_268.h = 1;
            local_268.d = 1;
            local_268.c = 1;
            m_3.cstep = (size_t)local_358.w;
            m_3.data = (void *)(CONCAT44(local_358.elemsize._4_4_,(undefined4)local_358.elemsize) *
                                m_3.cstep + (long)local_358.data);
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_358.elemsize;
            m_3.elemsize._4_4_ = local_358.elemsize._4_4_;
            m_3.elempack = local_358.elempack;
            m_3.allocator = local_358.allocator;
            m_3.w = local_358.w;
            m_3.dims = 2;
            m_3.h = 1;
            m_3.d = 1;
            m_3.c = 1;
            p_Var2 = this->_vptr_LSTM_x86_fma[-3];
            m_4.c = *(int *)(&this->field_0x15c + (long)p_Var2);
            uVar9 = *(ulong *)(&this->field_0x138 + (long)p_Var2);
            m_4.data = (void *)(*(long *)(&this->field_0x168 + (long)p_Var2) * uVar9 +
                               *(long *)(&this->field_0x128 + (long)p_Var2));
            m_4.elempack = *(int *)(&this->field_0x140 + (long)p_Var2);
            m_4.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var2);
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = (undefined4)uVar9;
            m_4.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_4.d = 1;
            m_4.h = *(int *)(&this->field_0x158 + (long)p_Var2);
            sVar6 = (long)*(int *)(&this->field_0x158 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x154 + (long)p_Var2);
            m_4.w = *(int *)(&this->field_0x154 + (long)p_Var2);
            m_4.dims = *(int *)(&this->field_0x150 + (long)p_Var2) + -1;
            m_4.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
            if (*(int *)(&this->field_0x150 + (long)p_Var2) == 4) {
              m_4.cstep = sVar6;
            }
            m_5.c = *(int *)(&this->field_0x1a4 + (long)p_Var2);
            uVar9 = *(ulong *)(&this->field_0x180 + (long)p_Var2);
            m_5.data = (void *)(*(long *)(&this->field_0x1b0 + (long)p_Var2) * uVar9 +
                               *(long *)(&this->field_0x170 + (long)p_Var2));
            m_5.elempack = *(int *)(&this->field_0x188 + (long)p_Var2);
            m_5.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var2);
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = (undefined4)uVar9;
            m_5.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_5.d = 1;
            m_5.h = *(int *)(&this->field_0x1a0 + (long)p_Var2);
            sVar6 = (long)*(int *)(&this->field_0x1a0 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x19c + (long)p_Var2);
            m_5.w = *(int *)(&this->field_0x19c + (long)p_Var2);
            m_5.dims = *(int *)(&this->field_0x198 + (long)p_Var2) + -1;
            m_5.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
            if (*(int *)(&this->field_0x198 + (long)p_Var2) == 4) {
              m_5.cstep = sVar6;
            }
            m_6.c = *(int *)(&this->field_0x114 + (long)p_Var2);
            uVar9 = *(ulong *)(&this->field_0xf0 + (long)p_Var2);
            m_6.data = (void *)(*(long *)(&this->field_0x120 + (long)p_Var2) * uVar9 +
                               *(long *)(&this->field_0xe0 + (long)p_Var2));
            m_6.elempack = *(int *)(&this->field_0xf8 + (long)p_Var2);
            m_6.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var2);
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar9;
            m_6.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_6.d = 1;
            m_6.h = *(int *)(&this->field_0x110 + (long)p_Var2);
            sVar6 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x10c + (long)p_Var2);
            m_6.w = *(int *)(&this->field_0x10c + (long)p_Var2);
            m_6.dims = *(int *)(&this->field_0x108 + (long)p_Var2) + -1;
            m_6.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
            if (*(int *)(&this->field_0x108 + (long)p_Var2) == 4) {
              m_6.cstep = sVar6;
            }
            iVar5 = lstm(bottom_blob,&m_1,1,&m_4,&m_5,&m_6,&local_268,&m_3,opt);
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
            piVar4 = (int *)CONCAT44(m_5.refcount._4_4_,m_5.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m_5.allocator == (Allocator *)0x0) {
                  if (m_5.data != (void *)0x0) {
                    free(m_5.data);
                  }
                }
                else {
                  (*(m_5.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_5.cstep = 0;
            m_5.data = (void *)0x0;
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = 0;
            m_5.elemsize._4_4_ = 0;
            m_5.elempack = 0;
            m_5.dims = 0;
            m_5.w = 0;
            m_5.h = 0;
            m_5.d = 0;
            m_5.c = 0;
            piVar4 = (int *)CONCAT44(m_4.refcount._4_4_,m_4.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m_4.allocator == (Allocator *)0x0) {
                  if (m_4.data != (void *)0x0) {
                    free(m_4.data);
                  }
                }
                else {
                  (*(m_4.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_4.cstep = 0;
            m_4.data = (void *)0x0;
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = 0;
            m_4.elemsize._4_4_ = 0;
            m_4.elempack = 0;
            m_4.dims = 0;
            m_4.w = 0;
            m_4.h = 0;
            m_4.d = 0;
            m_4.c = 0;
            bVar10 = iVar5 == 0;
            if ((bVar10) && (iVar5 = local_35c, 0 < (int)_h)) {
              uVar9 = 0;
              do {
                pvVar8 = (void *)((long)m_1.w * uVar9 *
                                  CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                 (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar9 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar9 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),
                       (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]) << 2);
                memcpy((void *)((long)__dest +
                               (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]
                                             ) * 4),pvVar8,
                       (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]) << 2);
                uVar9 = uVar9 + 1;
              } while (_h != uVar9);
            }
            piVar4 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            piVar4 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_268.allocator == (Allocator *)0x0) {
                  if (local_268.data != (void *)0x0) {
                    free(local_268.data);
                  }
                }
                else {
                  (*(local_268.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar10 = false;
          }
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.h = 0;
          local_268.d = 0;
          local_268.dims = 0;
          local_268.w = 0;
          local_268.elempack = 0;
          local_268.elemsize._4_4_ = 0;
          local_268.elemsize._0_4_ = 0;
          local_268.refcount._4_4_ = 0;
          local_268.refcount._0_4_ = 0;
          local_268.data = (void *)0x0;
          piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                }
              }
              else {
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_c8.cstep = 0;
          local_c8.data = (void *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_2.cstep = 0;
          m_2.data = (void *)0x0;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = 0;
          m_2.elemsize._4_4_ = 0;
          m_2.elempack = 0;
          m_2.dims = 0;
          m_2.w = 0;
          m_2.h = 0;
          m_2.d = 0;
          m_2.c = 0;
        }
        piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      if (!bVar10) goto LAB_003c91ce;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0;
    if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar3 == 0xd8) {
      if (pMVar3 + 1 != &local_308) {
        piVar4 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar3[1].refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (pMVar3[1].allocator == (Allocator *)0x0) {
              if (pMVar3[1].data != (void *)0x0) {
                free(pMVar3[1].data);
              }
            }
            else {
              (*(pMVar3[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3[1].cstep = 0;
        *(undefined8 *)((long)&pMVar3[1].refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3[1].elemsize + 4) = 0;
        pMVar3[1].data = (void *)0x0;
        pMVar3[1].refcount = (int *)0x0;
        pMVar3[1].dims = 0;
        pMVar3[1].w = 0;
        pMVar3[1].h = 0;
        pMVar3[1].d = 0;
        pMVar3[1].c = 0;
        pMVar3[1].data = local_308.data;
        pMVar3[1].refcount = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
        pMVar3[1].elemsize = CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize);
        pMVar3[1].elempack = local_308.elempack;
        pMVar3[1].allocator = local_308.allocator;
        pMVar3[1].dims = local_308.dims;
        pMVar3[1].w = local_308.w;
        pMVar3[1].h = local_308.h;
        pMVar3[1].d = local_308.d;
        pMVar3[1].c = local_308.c;
        pMVar3[1].cstep = local_308.cstep;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = 0;
      if (pMVar3 + 2 != &local_358) {
        piVar4 = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar3[2].refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (pMVar3[2].allocator == (Allocator *)0x0) {
              if (pMVar3[2].data != (void *)0x0) {
                free(pMVar3[2].data);
              }
            }
            else {
              (*(pMVar3[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3[2].cstep = 0;
        *(undefined8 *)((long)&pMVar3[2].refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3[2].elemsize + 4) = 0;
        pMVar3[2].data = (void *)0x0;
        pMVar3[2].refcount = (int *)0x0;
        pMVar3[2].dims = 0;
        pMVar3[2].w = 0;
        pMVar3[2].h = 0;
        pMVar3[2].d = 0;
        pMVar3[2].c = 0;
        pMVar3[2].data = local_358.data;
        pMVar3[2].refcount = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
        pMVar3[2].elemsize = CONCAT44(local_358.elemsize._4_4_,(undefined4)local_358.elemsize);
        pMVar3[2].elempack = local_358.elempack;
        pMVar3[2].allocator = local_358.allocator;
        pMVar3[2].dims = local_358.dims;
        pMVar3[2].w = local_358.w;
        pMVar3[2].h = local_358.h;
        pMVar3[2].d = local_358.d;
        pMVar3[2].c = local_358.c;
        pMVar3[2].cstep = local_358.cstep;
      }
    }
  }
LAB_003c91ce:
  piVar4 = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_358.allocator == (Allocator *)0x0) {
        if (local_358.data != (void *)0x0) {
          free(local_358.data);
        }
      }
      else {
        (*(local_358.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_358.cstep = 0;
  local_358.data = (void *)0x0;
  local_358.refcount._0_4_ = 0;
  local_358.refcount._4_4_ = 0;
  local_358.elemsize._0_4_ = 0;
  local_358.elemsize._4_4_ = 0;
  local_358.elempack = 0;
  local_358.dims = 0;
  local_358.w = 0;
  local_358.h = 0;
  local_358.d = 0;
  local_358.c = 0;
  piVar4 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_308.allocator == (Allocator *)0x0) {
        if (local_308.data != (void *)0x0) {
          free(local_308.data);
        }
      }
      else {
        (*(local_308.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int LSTM_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __AVX__
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
#else
    return LSTM::forward(bottom_blobs, top_blobs, opt);
#endif
}